

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O2

value value_create(void *data,size_t bytes)

{
  value __dest;
  void *pvVar1;
  
  __dest = value_alloc(bytes);
  if (__dest != (value)0x0) {
    pvVar1 = memcpy(__dest,data,bytes);
    return pvVar1;
  }
  return (value)0x0;
}

Assistant:

value value_create(const void *data, size_t bytes)
{
	value v = value_alloc(bytes);

	if (v == NULL)
	{
		return NULL;
	}

	memcpy(v, data, bytes);

	return v;
}